

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::bitcastToAPInt(IEEEFloat *this)

{
  long *in_RSI;
  APInt AVar2;
  IEEEFloat *this_local;
  undefined8 uVar1;
  
  if ((undefined1 *)*in_RSI == semIEEEhalf) {
    AVar2 = convertHalfAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  else if ((undefined1 *)*in_RSI == semIEEEsingle) {
    AVar2 = convertFloatAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  else if ((undefined1 *)*in_RSI == semIEEEdouble) {
    AVar2 = convertDoubleAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  else if ((undefined1 *)*in_RSI == semIEEEquad) {
    AVar2 = convertQuadrupleAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  else if ((undefined1 *)*in_RSI == semPPCDoubleDoubleLegacy) {
    AVar2 = convertPPCDoubleDoubleAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  else {
    if ((undefined1 *)*in_RSI != semX87DoubleExtended) {
      __assert_fail("semantics == (const llvm::fltSemantics*)&semX87DoubleExtended && \"unknown format!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xbc7,"APInt llvm::detail::IEEEFloat::bitcastToAPInt() const");
    }
    AVar2 = convertF80LongDoubleAPFloatToAPInt(this);
    uVar1 = AVar2._8_8_;
  }
  AVar2._8_8_ = uVar1;
  AVar2.U.pVal = (uint64_t *)this;
  return AVar2;
}

Assistant:

APInt IEEEFloat::bitcastToAPInt() const {
  if (semantics == (const llvm::fltSemantics*)&semIEEEhalf)
    return convertHalfAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEsingle)
    return convertFloatAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEdouble)
    return convertDoubleAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics*)&semIEEEquad)
    return convertQuadrupleAPFloatToAPInt();

  if (semantics == (const llvm::fltSemantics *)&semPPCDoubleDoubleLegacy)
    return convertPPCDoubleDoubleAPFloatToAPInt();

  assert(semantics == (const llvm::fltSemantics*)&semX87DoubleExtended &&
         "unknown format!");
  return convertF80LongDoubleAPFloatToAPInt();
}